

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O0

Query * plan_qstring(unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
                     *types_to_query,QString *value)

{
  bool bVar1;
  size_type sVar2;
  QString *string;
  QString *pQVar3;
  uint *puVar4;
  vector<QToken,_std::allocator<QToken>_> *in_RDX;
  Query *in_RDI;
  optional<unsigned_int> *gram;
  optional<unsigned_int> *hgram;
  optional<unsigned_int> *gram_2;
  optional<unsigned_int> *gram_1;
  int skip_to;
  int i;
  bool has_hash4;
  bool has_wide8;
  bool has_text4;
  bool has_gram3;
  vector<Query,_std::allocator<Query>_> plan;
  key_type *in_stack_fffffffffffffed8;
  unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
  *in_stack_fffffffffffffee0;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffee8;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffffef0;
  PrimitiveQuery local_c8;
  _Optional_payload_base<unsigned_int> local_c0;
  _Optional_payload_base<unsigned_int> *local_b8;
  PrimitiveQuery local_b0;
  _Optional_payload_base<unsigned_int> local_a8;
  _Optional_payload_base<unsigned_int> *local_a0;
  PrimitiveQuery local_98;
  _Optional_payload_base<unsigned_int> local_90;
  _Optional_payload_base<unsigned_int> *local_88;
  PrimitiveQuery local_80;
  _Optional_payload_base<unsigned_int> local_78;
  _Optional_payload_base<unsigned_int> *local_70;
  int local_64;
  int local_60;
  undefined4 local_5c;
  byte local_55;
  undefined4 local_54;
  byte local_4d;
  undefined4 local_4c;
  byte local_45;
  undefined4 local_38;
  byte local_31;
  vector<QToken,_std::allocator<QToken>_> *local_18;
  
  local_18 = in_RDX;
  std::vector<Query,_std::allocator<Query>_>::vector
            ((vector<Query,_std::allocator<Query>_> *)0x1c5de9);
  local_38 = 1;
  sVar2 = std::
          unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
          ::count(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_31 = sVar2 != 0;
  local_4c = 2;
  sVar2 = std::
          unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
          ::count(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_45 = sVar2 != 0;
  local_54 = 4;
  sVar2 = std::
          unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
          ::count(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_4d = sVar2 != 0;
  local_5c = 3;
  sVar2 = std::
          unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
          ::count(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_55 = sVar2 != 0;
  local_60 = 0;
  local_64 = 0;
LAB_001c5ee0:
  do {
    string = (QString *)(long)(local_60 + 2);
    pQVar3 = (QString *)std::vector<QToken,_std::allocator<QToken>_>::size(local_18);
    if (pQVar3 <= string) {
      q_and((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffee8);
      std::vector<Query,_std::allocator<Query>_>::~vector
                ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffef0);
      return in_RDI;
    }
    if ((local_4d & 1) != 0) {
      local_78 = (_Optional_payload_base<unsigned_int>)
                 convert_gram((IndexType)(sVar2 >> 0x20),(int)sVar2,string);
      local_70 = &local_78;
      bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1c5f67);
      if (bVar1) {
        puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x1c5f7d);
        PrimitiveQuery::PrimitiveQuery(&local_80,WIDE8,*puVar4);
        std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                  ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffef0,
                   (PrimitiveQuery *)in_stack_fffffffffffffee8);
        local_64 = local_60 + 6;
        local_60 = local_60 + 2;
        goto LAB_001c5ee0;
      }
    }
    if ((local_45 & 1) == 0) {
LAB_001c60ba:
      in_stack_fffffffffffffee8 =
           (_Optional_payload_base<unsigned_int>)
           convert_gram((IndexType)(sVar2 >> 0x20),(int)sVar2,string);
      local_a0 = &local_a8;
      local_a8 = in_stack_fffffffffffffee8;
      if (((local_64 + -1 <= local_60) && ((local_55 & 1) != 0)) &&
         (bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1c6123), bVar1))
      {
        puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x1c6136);
        PrimitiveQuery::PrimitiveQuery(&local_b0,HASH4,*puVar4);
        std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                  ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffef0,
                   (PrimitiveQuery *)in_stack_fffffffffffffee8);
      }
      local_c0 = (_Optional_payload_base<unsigned_int>)
                 convert_gram((IndexType)(sVar2 >> 0x20),(int)sVar2,string);
      local_b8 = &local_c0;
      if ((local_60 < local_64) ||
         (bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1c61ad), !bVar1))
      {
        local_60 = local_60 + 1;
      }
      else {
        if ((local_31 & 1) != 0) {
          puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x1c61c7);
          PrimitiveQuery::PrimitiveQuery(&local_c8,GRAM3,*puVar4);
          std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                    ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffef0,
                     (PrimitiveQuery *)in_stack_fffffffffffffee8);
        }
        local_60 = local_60 + 1;
      }
    }
    else {
      in_stack_fffffffffffffef0 =
           (_Optional_payload_base<unsigned_int>)
           convert_gram((IndexType)(sVar2 >> 0x20),(int)sVar2,string);
      local_88 = &local_90;
      local_90 = in_stack_fffffffffffffef0;
      bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1c6051);
      if (!bVar1) goto LAB_001c60ba;
      puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x1c6064);
      PrimitiveQuery::PrimitiveQuery(&local_98,TEXT4,*puVar4);
      std::vector<Query,_std::allocator<Query>_>::emplace_back<PrimitiveQuery>
                ((vector<Query,_std::allocator<Query>_> *)in_stack_fffffffffffffef0,
                 (PrimitiveQuery *)in_stack_fffffffffffffee8);
      local_64 = local_60 + 2;
      local_60 = local_60 + 1;
    }
  } while( true );
}

Assistant:

Query plan_qstring(const std::unordered_set<IndexType> &types_to_query,
                   const QString &value) {
    std::vector<Query> plan;

    bool has_gram3 = types_to_query.count(IndexType::GRAM3) != 0;
    bool has_text4 = types_to_query.count(IndexType::TEXT4) != 0;
    bool has_wide8 = types_to_query.count(IndexType::WIDE8) != 0;
    bool has_hash4 = types_to_query.count(IndexType::HASH4) != 0;

    // `i` is the current index. `skip_to` is used to keep track of last
    // "handled" byte. For example there's no point in adding 3gram "bcd"
    // when 4gram "abcd" was already added. Only relevant for wide8 ngrams.
    int i = 0;
    int skip_to = 0;
    while (i + 2 < value.size()) {
        // If wide8 index is supported, try to add a token and skip 6 bytes.
        if (has_wide8) {
            if (const auto &gram = convert_gram(IndexType::WIDE8, i, value)) {
                plan.emplace_back(PrimitiveQuery(IndexType::WIDE8, *gram));
                skip_to = i + 6;
                i += 2;
                continue;
            }
        }
        // If text4 index is supported, try to add a token and skip 2 bytes.
        if (has_text4) {
            if (const auto &gram = convert_gram(IndexType::TEXT4, i, value)) {
                plan.emplace_back(PrimitiveQuery(IndexType::TEXT4, *gram));
                skip_to = i + 2;
                i += 1;
                continue;
            }
        }
        // If hash4 index is supported and current ngram is not text, try hash4.
        const auto &hgram = convert_gram(IndexType::HASH4, i, value);
        if (i >= (skip_to - 1) && has_hash4 && hgram) {
            plan.emplace_back(PrimitiveQuery(IndexType::HASH4, *hgram));
            // Don't continue here - gram3 can give us more information.
        }
        // Otherwise, add a regular gram3 token.
        const auto &gram = convert_gram(IndexType::GRAM3, i, value);
        if (i >= skip_to && gram) {
            if (has_gram3) {
                plan.emplace_back(PrimitiveQuery(IndexType::GRAM3, *gram));
            }
            i += 1;
            continue;
        }
        // If no ngram can be added, remember to move forward.
        i += 1;
    }

    return q_and(std::move(plan));
}